

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

void __thiscall Lowerer::LowerFunctionBodyCallCountChange(Lowerer *this,Instr *insertBeforeInstr)

{
  Func *pFVar1;
  code *pcVar2;
  undefined8 instr;
  bool bVar3;
  ExecutionMode EVar4;
  byte bVar5;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar6;
  JITTimeFunctionBody *this_00;
  FunctionJITTimeInfo *this_01;
  StackSym *sym;
  RegOpnd *pRVar7;
  Var address;
  AddrOpnd *src;
  IndirOpnd *opnd;
  Instr *instr_00;
  HelperCallOpnd *this_02;
  IntConstOpnd *src2;
  undefined1 local_68 [8];
  AutoReuseOpnd autoReuseCountAddressOpnd;
  AutoReuseOpnd autoReuseCountOpnd;
  Instr *onOverflowInsertBeforeInstr;
  
  if (insertBeforeInstr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x684c,"(insertBeforeInstr)","insertBeforeInstr");
    if (!bVar3) goto LAB_005e9ff3;
    *puVar6 = 0;
  }
  pFVar1 = insertBeforeInstr->m_func;
  EVar4 = JITTimeWorkItem::GetJitMode(pFVar1->m_workItem);
  if (EVar4 == SimpleJit) {
    this_00 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_00);
    this_01 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
    functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_01);
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,FullJitPhase,sourceContextId,functionId);
    if (bVar3) {
      return;
    }
  }
  sym = StackSym::New(TyUint64,pFVar1);
  pRVar7 = IR::RegOpnd::New(sym,TyUint64,pFVar1);
  local_68 = (undefined1  [8])0x0;
  IR::AutoReuseOpnd::Initialize((AutoReuseOpnd *)local_68,&pRVar7->super_Opnd,pFVar1,true);
  address = (Var)JITTimeWorkItem::GetCallsCountAddress(pFVar1->m_workItem);
  src = IR::AddrOpnd::New(address,AddrOpndKindDynamicMisc,pFVar1,true,(Var)0x0);
  InsertMove(&pRVar7->super_Opnd,&src->super_Opnd,insertBeforeInstr,true);
  opnd = IR::IndirOpnd::New(pRVar7,0,TyUint32,pFVar1,false);
  autoReuseCountAddressOpnd.autoDelete = false;
  autoReuseCountAddressOpnd.wasInUse = false;
  autoReuseCountAddressOpnd._18_6_ = 0;
  IR::AutoReuseOpnd::Initialize
            ((AutoReuseOpnd *)&autoReuseCountAddressOpnd.autoDelete,&opnd->super_Opnd,pFVar1,true);
  if (EVar4 == SimpleJit) {
    InsertDecUInt32PreventOverflow
              (&opnd->super_Opnd,&opnd->super_Opnd,insertBeforeInstr,
               (Instr **)&autoReuseCountOpnd.autoDelete);
    instr = autoReuseCountOpnd._16_8_;
    pRVar7 = IR::Opnd::CreateFramePointerOpnd(pFVar1);
    LowererMD::LoadHelperArgument(&this->m_lowererMD,(Instr *)instr,&pRVar7->super_Opnd);
    instr_00 = IR::Instr::New(Call,pFVar1);
    this_02 = IR::HelperCallOpnd::New(HelperTransitionFromSimpleJit,pFVar1);
    if (instr_00->m_src1 != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
      if (!bVar3) goto LAB_005e9ff3;
      *puVar6 = 0;
    }
    pFVar1 = instr_00->m_func;
    if ((this_02->super_Opnd).isDeleted == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x14,"(!isDeleted)","Using deleted operand");
      if (!bVar3) {
LAB_005e9ff3:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
    bVar5 = (this_02->super_Opnd).field_0xb;
    if ((bVar5 & 2) != 0) {
      this_02 = (HelperCallOpnd *)IR::Opnd::Copy(&this_02->super_Opnd,pFVar1);
      bVar5 = (this_02->super_Opnd).field_0xb;
    }
    (this_02->super_Opnd).field_0xb = bVar5 | 2;
    instr_00->m_src1 = &this_02->super_Opnd;
    IR::Instr::InsertBefore((Instr *)autoReuseCountOpnd._16_8_,instr_00);
    LowererMD::LowerCall(&this->m_lowererMD,instr_00,0);
  }
  else {
    src2 = IR::IntConstOpnd::New(1,TyUint32,pFVar1,false);
    InsertAdd(false,&opnd->super_Opnd,&opnd->super_Opnd,&src2->super_Opnd,insertBeforeInstr);
  }
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&autoReuseCountAddressOpnd.autoDelete);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_68);
  return;
}

Assistant:

void Lowerer::LowerFunctionBodyCallCountChange(IR::Instr *const insertBeforeInstr)
{
    Assert(insertBeforeInstr);

    Func *const func = insertBeforeInstr->m_func;
    const bool isSimpleJit = func->IsSimpleJit();

    if ((isSimpleJit && PHASE_OFF(Js::FullJitPhase, m_func)))
    {
        return;
    }

    // mov countAddress, <countAddress>
    IR::RegOpnd *const countAddressOpnd = IR::RegOpnd::New(StackSym::New(TyMachPtr, func), TyMachPtr, func);
    const IR::AutoReuseOpnd autoReuseCountAddressOpnd(countAddressOpnd, func);
    InsertMove(
        countAddressOpnd,
        IR::AddrOpnd::New((Js::Var)func->GetWorkItem()->GetCallsCountAddress(), IR::AddrOpndKindDynamicMisc, func, true),
        insertBeforeInstr);

    IR::IndirOpnd *const countOpnd = IR::IndirOpnd::New(countAddressOpnd, 0, TyUint32, func);
    const IR::AutoReuseOpnd autoReuseCountOpnd(countOpnd, func);
    if(!isSimpleJit)
    {
        InsertAdd(false, countOpnd, countOpnd, IR::IntConstOpnd::New(1, TyUint32, func), insertBeforeInstr);
        return;
    }

    IR::Instr *onOverflowInsertBeforeInstr;
    InsertDecUInt32PreventOverflow(
        countOpnd,
        countOpnd,
        insertBeforeInstr,
        &onOverflowInsertBeforeInstr);

    //   ($overflow:)
    //     TransitionFromSimpleJit(framePointer)
    m_lowererMD.LoadHelperArgument(onOverflowInsertBeforeInstr, IR::Opnd::CreateFramePointerOpnd(func));
    IR::Instr *const callInstr = IR::Instr::New(Js::OpCode::Call, func);
    callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::HelperTransitionFromSimpleJit, func));
    onOverflowInsertBeforeInstr->InsertBefore(callInstr);
    m_lowererMD.LowerCall(callInstr, 0);
}